

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.cpp
# Opt level: O0

void __thiscall ANNkd_tree::~ANNkd_tree(ANNkd_tree *this)

{
  ANNpointSet *in_RDI;
  ANNpoint *in_stack_ffffffffffffffd0;
  
  in_RDI->_vptr_ANNpointSet = (_func_int **)&PTR__ANNkd_tree_00115c88;
  if ((in_RDI[7]._vptr_ANNpointSet != (_func_int **)0x0) &&
     (in_RDI[7]._vptr_ANNpointSet != (_func_int **)0x0)) {
    (**(code **)(*in_RDI[7]._vptr_ANNpointSet + 8))();
  }
  if ((in_RDI[6]._vptr_ANNpointSet != (_func_int **)0x0) &&
     (in_RDI[6]._vptr_ANNpointSet != (_func_int **)0x0)) {
    operator_delete__(in_RDI[6]._vptr_ANNpointSet);
  }
  if (in_RDI[8]._vptr_ANNpointSet != (_func_int **)0x0) {
    annDeallocPt(in_stack_ffffffffffffffd0);
  }
  if (in_RDI[9]._vptr_ANNpointSet != (_func_int **)0x0) {
    annDeallocPt(in_stack_ffffffffffffffd0);
  }
  if ((in_RDI[3]._vptr_ANNpointSet != (_func_int **)0x0) &&
     (in_RDI[3]._vptr_ANNpointSet != (_func_int **)0x0)) {
    operator_delete__(in_RDI[3]._vptr_ANNpointSet);
  }
  if ((in_RDI[2]._vptr_ANNpointSet != (_func_int **)0x0) &&
     (in_RDI[2]._vptr_ANNpointSet != (_func_int **)0x0)) {
    operator_delete__(in_RDI[2]._vptr_ANNpointSet);
  }
  ANNpointSet::~ANNpointSet(in_RDI);
  return;
}

Assistant:

ANNkd_tree::~ANNkd_tree()  // tree destructor
{
    if (root != NULL) delete root;
    if (pidx != NULL) delete[] pidx;
    if (bnd_box_lo != NULL) annDeallocPt(bnd_box_lo);
    if (bnd_box_hi != NULL) annDeallocPt(bnd_box_hi);
    if (Topology != NULL) delete[] Topology;
    if (Scale != NULL) delete[] Scale;
}